

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O0

void despot::AEMS::Update(QNode *qnode)

{
  VNode *this;
  bool bVar1;
  pointer ppVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  VNode *vnode;
  _Self local_30;
  iterator it;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *children;
  double upper;
  double lower;
  QNode *qnode_local;
  
  upper = qnode->step_reward;
  children = (map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
              *)qnode->step_reward;
  it._M_node = (_Base_ptr)QNode::children(qnode);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
       ::begin((map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                *)it._M_node);
  while( true ) {
    vnode = (VNode *)std::
                     map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                     ::end((map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                            *)it._M_node);
    bVar1 = std::operator!=(&local_30,(_Self *)&vnode);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator->
                       (&local_30);
    this = ppVar2->second;
    dVar3 = Globals::Discount();
    dVar5 = this->likelihood;
    dVar4 = VNode::lower_bound(this);
    upper = dVar3 * dVar5 * dVar4 + upper;
    dVar3 = Globals::Discount();
    dVar5 = this->likelihood;
    dVar4 = VNode::upper_bound(this);
    children = (map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                *)(dVar3 * dVar5 * dVar4 + (double)children);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator++
              (&local_30,0);
  }
  dVar5 = QNode::lower_bound(qnode);
  if (dVar5 < upper) {
    QNode::lower_bound(qnode,upper);
  }
  dVar5 = QNode::upper_bound(qnode);
  if ((double)children < dVar5) {
    QNode::upper_bound(qnode,(double)children);
  }
  return;
}

Assistant:

void AEMS::Update(QNode* qnode) {
	double lower = qnode->step_reward;
	double upper = qnode->step_reward;

	map<OBS_TYPE, VNode*>& children = qnode->children();
	for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
			it != children.end(); it++) {
		VNode* vnode = it->second;

		lower += Globals::Discount() * vnode->likelihood * vnode->lower_bound();
		upper += Globals::Discount() * vnode->likelihood * vnode->upper_bound();
	}

	if (lower > qnode->lower_bound())
		qnode->lower_bound(lower);
	if (upper < qnode->upper_bound())
		qnode->upper_bound(upper);
}